

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O2

void __thiscall booster::locale::ios_info::ios_info(ios_info *this)

{
  string asStack_38 [32];
  
  this->flags_ = 0;
  this->domain_id_ = 0;
  (this->time_zone_)._M_dataplus._M_p = (pointer)&(this->time_zone_).field_2;
  (this->time_zone_)._M_string_length = 0;
  (this->time_zone_).field_2._M_local_buf[0] = '\0';
  string_set::string_set(&this->datetime_);
  this->d = (data *)0x0;
  locale::time_zone::global_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->time_zone_,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

ios_info::ios_info() : 
            flags_(0),
            domain_id_(0),
            d(0)
        {
            time_zone_ = time_zone::global();
        }